

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseMedia(Parser *this,MediaRule *mediaRule)

{
  bool bVar1;
  StyleRule *in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  StyleRule rule;
  parameter_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  TokenType in_stack_ffffffffffffff94;
  Parser *this_00;
  byte local_41;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  do {
    skipSpace((Parser *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar1 = parseNextMedium(in_RDI,(QStringList *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (!bVar1) {
      local_41 = 0;
      goto LAB_00a3acdc;
    }
    bVar1 = test(in_RDI,in_stack_ffffffffffffff94);
  } while (bVar1);
  bVar1 = next(in_RDI,in_stack_ffffffffffffff94);
  if (bVar1) {
    skipSpace((Parser *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    do {
      bVar1 = testRuleset((Parser *)0xa3ac37);
      if (!bVar1) {
        bVar1 = next(in_RDI,in_stack_ffffffffffffff94);
        if (bVar1) {
          skipSpace((Parser *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          local_41 = 1;
        }
        else {
          local_41 = 0;
        }
        break;
      }
      memset(local_40,0xaa,0x38);
      StyleRule::StyleRule
                ((StyleRule *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      bVar1 = parseRuleset(this_00,in_RSI);
      if (bVar1) {
        QList<QCss::StyleRule>::append
                  ((QList<QCss::StyleRule> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
      }
      else {
        local_41 = 0;
      }
      StyleRule::~StyleRule
                ((StyleRule *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    } while (bVar1);
  }
  else {
    local_41 = 0;
  }
LAB_00a3acdc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool Parser::parseMedia(MediaRule *mediaRule)
{
    do {
        skipSpace();
        if (!parseNextMedium(&mediaRule->media)) return false;
    } while (test(COMMA));

    if (!next(LBRACE)) return false;
    skipSpace();

    while (testRuleset()) {
        StyleRule rule;
        if (!parseRuleset(&rule)) return false;
        mediaRule->styleRules.append(rule);
    }

    if (!next(RBRACE)) return false;
    skipSpace();
    return true;
}